

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O3

void test_dict_inflate(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  undefined8 uVar3;
  Byte *pBVar4;
  Byte *uncompr_00;
  char *pcVar5;
  Byte **unaff_R14;
  char *pcVar6;
  uLong uStack_b0;
  Byte *pBStack_a8;
  undefined1 *puStack_a0;
  char *pcStack_98;
  Byte *local_88;
  undefined4 local_80;
  Byte *local_70;
  undefined4 local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  uLong local_28;
  
  builtin_memcpy(uncompr,"garbage",8);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  local_80 = (undefined4)comprLen;
  pcVar5 = "1.2.8";
  local_88 = compr;
  iVar1 = inflateInit_(&local_88,"1.2.8",0x70);
  if (iVar1 == 0) {
    local_68 = (undefined4)uncomprLen;
    pcVar6 = "hello";
    local_70 = uncompr;
    do {
      pcVar5 = (char *)0x0;
      iVar1 = inflate(&local_88);
      if (iVar1 == 2) {
        if (local_28 != dictId) {
          test_dict_inflate_cold_2();
          unaff_R14 = &local_88;
          uncomprLen = (uLong)pcVar6;
          goto LAB_0010358d;
        }
        pcVar5 = "hello";
        iVar1 = inflateSetDictionary(&local_88,"hello",6);
      }
      else if (iVar1 == 1) goto LAB_0010354e;
    } while (iVar1 == 0);
    test_dict_inflate_cold_5();
LAB_0010354e:
    iVar1 = inflateEnd(&local_88);
    unaff_R14 = &local_88;
    if (iVar1 == 0) {
      pcVar5 = hello;
      pBVar4 = uncompr;
      iVar2 = strcmp((char *)uncompr,hello);
      iVar1 = (int)pBVar4;
      unaff_R14 = &local_88;
      if (iVar2 == 0) {
        printf("inflate with dictionary: %s\n",uncompr);
        return;
      }
      goto LAB_0010359b;
    }
  }
  else {
LAB_0010358d:
    test_dict_inflate_cold_1();
    pcVar6 = (char *)uncomprLen;
    iVar1 = extraout_EAX;
  }
  test_dict_inflate_cold_3();
LAB_0010359b:
  test_dict_inflate_cold_4();
  uStack_b0 = 40000;
  pBStack_a8 = uncompr;
  puStack_a0 = (undefined1 *)unaff_R14;
  pcStack_98 = pcVar6;
  pcVar6 = (char *)zlibVersion();
  if (*pcVar6 == '1') {
    pcVar6 = (char *)zlibVersion();
    iVar2 = strcmp(pcVar6,"1.2.8");
    if (iVar2 != 0) {
      main_cold_2();
    }
    uVar3 = zlibCompileFlags();
    printf("zlib version %s = 0x%04x, compile flags = 0x%lx\n","1.2.8",0x1280,uVar3);
    pBVar4 = (Byte *)calloc(40000,1);
    uncompr_00 = (Byte *)calloc(40000,1);
    if ((pBVar4 != (Byte *)0x0) && (uncompr_00 != (Byte *)0x0)) {
      test_compress(pBVar4,40000,uncompr_00,40000);
      if (iVar1 < 2) {
        pcVar5 = "foo.gz";
      }
      else {
        pcVar5 = *(char **)(pcVar5 + 8);
      }
      test_gzio(pcVar5,uncompr_00,40000);
      test_deflate(pBVar4,40000);
      test_inflate(pBVar4,40000,uncompr_00,40000);
      test_large_deflate(pBVar4,40000,uncompr_00,40000);
      test_large_inflate(pBVar4,40000,uncompr_00,40000);
      test_flush(pBVar4,&uStack_b0);
      test_sync(pBVar4,uStack_b0,uncompr_00,40000);
      test_dict_deflate(pBVar4,40000);
      test_dict_inflate(pBVar4,40000,uncompr_00,40000);
      free(pBVar4);
      free(uncompr_00);
      return;
    }
  }
  else {
    main_cold_1();
  }
  puts("out of memory");
  exit(1);
}

Assistant:

void test_dict_inflate(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    int err;
    z_stream d_stream; /* decompression stream */

    strcpy((char*)uncompr, "garbage");

    d_stream.zalloc = zalloc;
    d_stream.zfree = zfree;
    d_stream.opaque = (voidpf)0;

    d_stream.next_in  = compr;
    d_stream.avail_in = (uInt)comprLen;

    err = inflateInit(&d_stream);
    CHECK_ERR(err, "inflateInit");

    d_stream.next_out = uncompr;
    d_stream.avail_out = (uInt)uncomprLen;

    for (;;) {
        err = inflate(&d_stream, Z_NO_FLUSH);
        if (err == Z_STREAM_END) break;
        if (err == Z_NEED_DICT) {
            if (d_stream.adler != dictId) {
                fprintf(stderr, "unexpected dictionary");
                exit(1);
            }
            err = inflateSetDictionary(&d_stream, (const Bytef*)dictionary,
                                       (int)sizeof(dictionary));
        }
        CHECK_ERR(err, "inflate with dict");
    }

    err = inflateEnd(&d_stream);
    CHECK_ERR(err, "inflateEnd");

    if (strcmp((char*)uncompr, hello)) {
        fprintf(stderr, "bad inflate with dict\n");
        exit(1);
    } else {
        printf("inflate with dictionary: %s\n", (char *)uncompr);
    }
}